

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O0

int Abc_ZddPermProduct(Abc_ZddMan *p,int a,int b)

{
  int iVar1;
  int iVar2;
  Abc_ZddObj *pAVar3;
  int r;
  int r1;
  int r0;
  Abc_ZddObj *B;
  int b_local;
  int a_local;
  Abc_ZddMan *p_local;
  
  if (a == 0) {
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = b;
    if (a != 1) {
      if (b == 0) {
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ = a;
        if ((b != 1) && (p_local._4_4_ = Abc_ZddCacheLookup(p,a,b,6), p_local._4_4_ < 0)) {
          pAVar3 = Abc_ZddNode(p,b);
          iVar1 = Abc_ZddPermProduct(p,a,pAVar3->False);
          iVar2 = Abc_ZddPermProduct(p,a,pAVar3->True);
          iVar2 = Abc_ZddPerm(p,iVar2,*(uint *)pAVar3 & 0x7fffffff);
          iVar1 = Abc_ZddUnion(p,iVar1,iVar2);
          p_local._4_4_ = Abc_ZddCacheInsert(p,a,b,6,iVar1);
        }
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int Abc_ZddPermProduct( Abc_ZddMan * p, int a, int b )
{
    Abc_ZddObj * B; 
    int r0, r1, r;
    if ( a == 0 ) return 0;
    if ( a == 1 ) return b;
    if ( b == 0 ) return 0;
    if ( b == 1 ) return a;
    if ( (r = Abc_ZddCacheLookup(p, a, b, ABC_ZDD_OPER_PERM_PROD)) >= 0 )
        return r;
    B  = Abc_ZddNode( p, b );
    r0 = Abc_ZddPermProduct( p, a, B->False ); 
    r1 = Abc_ZddPermProduct( p, a, B->True ); 
    r1 = Abc_ZddPerm( p, r1, B->Var );
    r  = Abc_ZddUnion( p, r0, r1 );
    return Abc_ZddCacheInsert( p, a, b, ABC_ZDD_OPER_PERM_PROD, r );
}